

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,XMLCh *toTranscode,char *toFill,XMLSize_t maxChars,
          MemoryManager *manager)

{
  int iVar1;
  bool bVar2;
  UErrorCode err;
  XMLMutexLock lockConverter;
  ArrayJanitor<char16_t> janTmp;
  
  if ((toTranscode == (XMLCh *)0x0 || maxChars == 0) || (*toTranscode == L'\0')) {
    *toFill = '\0';
    bVar2 = true;
  }
  else {
    ArrayJanitor<char16_t>::ArrayJanitor(&janTmp,(char16_t *)0x0,manager);
    err = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&lockConverter,&this->fMutex);
    iVar1 = ucnv_fromUChars_70(this->fConverter,toFill,maxChars & 0xffffffff,toTranscode,
                               0xffffffffffffffff,&err);
    XMLMutexLock::~XMLMutexLock(&lockConverter);
    bVar2 = err < U_ILLEGAL_ARGUMENT_ERROR;
    if (err < U_ILLEGAL_ARGUMENT_ERROR) {
      toFill[iVar1] = '\0';
    }
    ArrayJanitor<char16_t>::~ArrayJanitor(&janTmp);
  }
  return bVar2;
}

Assistant:

bool ICULCPTranscoder::transcode(   const   XMLCh* const    toTranscode
                                    ,       char* const     toFill
                                    , const XMLSize_t       maxChars
                                    , MemoryManager* const  manager)
{
    // Watch for a few psycho corner cases
    if (!toTranscode || !maxChars)
    {
        toFill[0] = 0;
        return true;
    }

    if (!*toTranscode)
    {
        toFill[0] = 0;
        return true;
    }

    //
    //  If XMLCh and UChar are not the same size, then we have to make a
    //  temp copy of the text to pass to ICU.
    //
    const UChar* actualSrc;
    UChar* ncActual = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        actualSrc = (const UChar*)toTranscode;
    }
    else
    {
        // Allocate a non-const temp buf, but store it also in the actual
        ncActual = convertToUChar(toTranscode, 0, manager);
        actualSrc = ncActual;
    }

    // Insure that the temp buffer, if any, gets cleaned up via the nc pointer
    ArrayJanitor<UChar> janTmp(ncActual, manager);

    //
    //  Use a faux block to enforce a lock on the converter while we do this.
    //  It will be released immediately after its done.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    {
        XMLMutexLock lockConverter(&fMutex);
        targetCap = ucnv_fromUChars
        (
            fConverter
            , toFill
            , (int32_t)maxChars
            , actualSrc
            , -1
            , &err
        );
    }

    if (U_FAILURE(err))
        return false;

    toFill[targetCap] = 0;
    return true;
}